

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_multi_statemach(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  ulong in_RAX;
  _Bool ssldone;
  undefined8 uStack_28;
  
  pcVar1 = data->conn;
  uStack_28 = in_RAX;
  if (((pcVar1->handler->flags & 1) != 0) && ((*(byte *)((long)&pcVar1->proto + 0xe2) & 1) == 0)) {
    uStack_28 = in_RAX & 0xffffffffffffff;
    CVar2 = Curl_conn_connect(data,0,false,(_Bool *)((long)&uStack_28 + 7));
    *(byte *)((long)&pcVar1->proto + 0xe2) =
         *(byte *)((long)&pcVar1->proto + 0xe2) & 0xfe | uStack_28._7_1_;
    if (uStack_28._7_1_ == 0 || CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  *done = (pcVar1->proto).pop3c.state == POP3_STOP;
  return CVar2;
}

Assistant:

static CURLcode pop3_multi_statemach(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if((conn->handler->flags & PROTOPT_SSL) && !pop3c->ssldone) {
    bool ssldone = FALSE;
    result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
    pop3c->ssldone = ssldone;
    if(result || !pop3c->ssldone)
      return result;
  }

  result = Curl_pp_statemach(data, &pop3c->pp, FALSE, FALSE);
  *done = (pop3c->state == POP3_STOP) ? TRUE : FALSE;

  return result;
}